

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement.hpp
# Opt level: O2

void duckdb::PreparedStatement::
     VerifyParameters<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
               (case_insensitive_map_t<duckdb::unique_ptr<duckdb::ParsedExpression>_> *provided,
               case_insensitive_map_t<idx_t> *expected)

{
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  InvalidInputException *pIVar4;
  case_insensitive_map_t<duckdb::unique_ptr<duckdb::ParsedExpression>_> *in_RCX;
  __node_base *p_Var5;
  case_insensitive_map_t<idx_t> *__range3;
  string local_50;
  
  uVar1 = (expected->_M_h)._M_element_count;
  uVar2 = (provided->_M_h)._M_element_count;
  if (uVar1 != uVar2) {
    pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    if (uVar2 < uVar1) {
      MissingValuesException<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                (&local_50,(PreparedStatement *)expected,(case_insensitive_map_t<idx_t> *)provided,
                 in_RCX);
      InvalidInputException::InvalidInputException(pIVar4,&local_50);
      __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ExcessValuesException<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              (&local_50,(PreparedStatement *)expected,(case_insensitive_map_t<idx_t> *)provided,
               in_RCX);
    InvalidInputException::InvalidInputException(pIVar4,&local_50);
    __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  p_Var5 = &(expected->_M_h)._M_before_begin;
  do {
    p_Var5 = p_Var5->_M_nxt;
    if (p_Var5 == (__node_base *)0x0) {
      return;
    }
    sVar3 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::count(&provided->_M_h,(key_type *)(p_Var5 + 1));
  } while (sVar3 != 0);
  pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  MissingValuesException<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (&local_50,(PreparedStatement *)expected,(case_insensitive_map_t<idx_t> *)provided,
             in_RCX);
  InvalidInputException::InvalidInputException(pIVar4,&local_50);
  __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void VerifyParameters(const case_insensitive_map_t<PAYLOAD> &provided,
	                             const case_insensitive_map_t<idx_t> &expected) {
		if (expected.size() == provided.size()) {
			// Same amount of identifiers, if
			for (auto &pair : expected) {
				auto &identifier = pair.first;
				if (!provided.count(identifier)) {
					throw InvalidInputException(MissingValuesException(expected, provided));
				}
			}
			return;
		}
		// Mismatch in expected and provided parameters/values
		if (expected.size() > provided.size()) {
			throw InvalidInputException(MissingValuesException(expected, provided));
		} else {
			D_ASSERT(provided.size() > expected.size());
			throw InvalidInputException(ExcessValuesException(expected, provided));
		}
	}